

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O0

bool __thiscall QAnimationGroup::event(QAnimationGroup *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QAbstractAnimation *pQVar3;
  QList<QAbstractAnimation_*> *pQVar4;
  const_iterator __last;
  const_iterator cVar5;
  const_iterator in_RSI;
  QList<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  QChildEvent *childEvent_1;
  QAbstractAnimation *a;
  QChildEvent *childEvent;
  QAnimationGroupPrivate *d;
  const_iterator it;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QAbstractAnimation *in_stack_ffffffffffffff98;
  QAnimationGroup *in_stack_ffffffffffffffa0;
  int index;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAnimationGroup *)0x67bcff);
  TVar2 = QEvent::type((QEvent *)in_RSI.i);
  if (TVar2 == ChildAdded) {
    QChildEvent::child((QChildEvent *)in_RSI.i);
    pQVar3 = qobject_cast<QAbstractAnimation*>((QObject *)0x67bd2f);
    if ((pQVar3 != (QAbstractAnimation *)0x0) &&
       (pQVar4 = (QList<QAbstractAnimation_*> *)
                 QAbstractAnimation::group((QAbstractAnimation *)in_RDI), pQVar4 != in_RDI)) {
      addAnimation(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    TVar2 = QEvent::type((QEvent *)in_RSI.i);
    if (TVar2 == ChildRemoved) {
      local_10.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
      __last = QList<QAbstractAnimation_*>::cbegin(in_RDI);
      cVar5 = QList<QAbstractAnimation_*>::cend(in_RDI);
      index = (int)((ulong)cVar5.i >> 0x20);
      QChildEvent::child((QChildEvent *)in_RSI.i);
      local_10 = std::find<QList<QAbstractAnimation*>::const_iterator,QObject*>
                           (in_RSI,__last,(QObject **)in_RDI);
      cVar5 = QList<QAbstractAnimation_*>::cend(in_RDI);
      bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_10,cVar5);
      if (bVar1) {
        cVar5 = QList<QAbstractAnimation_*>::cbegin(in_RDI);
        QList<QAbstractAnimation_*>::const_iterator::operator-(&local_10,cVar5);
        takeAnimation((QAnimationGroup *)__last.i,index);
      }
    }
  }
  bVar1 = QAbstractAnimation::event
                    ((QAbstractAnimation *)in_RDI,
                     (QEvent *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QAnimationGroup::event(QEvent *event)
{
    Q_D(QAnimationGroup);
    if (event->type() == QEvent::ChildAdded) {
        QChildEvent *childEvent = static_cast<QChildEvent *>(event);
        if (QAbstractAnimation *a = qobject_cast<QAbstractAnimation *>(childEvent->child())) {
            if (a->group() != this)
                addAnimation(a);
        }
    } else if (event->type() == QEvent::ChildRemoved) {
        QChildEvent *childEvent = static_cast<QChildEvent *>(event);
        // You can only rely on the child being a QObject because in the QEvent::ChildRemoved
        // case it might be called from the destructor. Casting down to QAbstractAnimation then
        // entails undefined behavior, so compare items as QObjects (which std::find does internally):
        const QList<QAbstractAnimation *>::const_iterator it
            = std::find(d->animations.cbegin(), d->animations.cend(), childEvent->child());
        if (it != d->animations.cend())
            takeAnimation(it - d->animations.cbegin());
    }
    return QAbstractAnimation::event(event);
}